

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

CaseGenerateSyntax * __thiscall
slang::parsing::Parser::parseCaseGenerateConstruct(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  SourceLocation SVar4;
  ExpressionSyntax *pEVar5;
  undefined8 uVar6;
  undefined4 extraout_var;
  MemberSyntax *pMVar7;
  StandardCaseItemSyntax *pSVar8;
  Diagnostic *this_01;
  DefaultCaseItemSyntax *pDVar9;
  undefined4 extraout_var_00;
  CaseGenerateSyntax *pCVar10;
  ulong uVar11;
  Info *extraout_RDX;
  Info *src;
  Token TVar12;
  Token TVar13;
  Token TVar14;
  Token openParen;
  Token keyword;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SourceLocation local_220;
  Token local_210;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_200;
  ulong local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1d8;
  ulong local_1c8;
  Token local_1c0;
  Token local_1b0;
  ExpressionSyntax *local_1a0;
  Info *local_198;
  undefined8 local_190;
  Info *local_188;
  undefined8 local_180;
  pointer local_178;
  Info *local_170;
  Token local_168;
  undefined8 local_158;
  Info *pIStack_150;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_148 [2];
  undefined1 local_108 [24];
  undefined1 auStack_f0 [24];
  __extent_storage<18446744073709551615UL> local_d8;
  
  local_170 = (Info *)attributes._M_extent._M_extent_value;
  local_178 = attributes._M_ptr;
  local_1c0 = ParserBase::consume(&this->super_ParserBase);
  TVar12 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_198 = TVar12.info;
  local_190 = TVar12._0_8_;
  local_1a0 = parseExpression(this);
  TVar12 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 5;
  this_00 = &this->factory;
  local_220 = (SourceLocation)0x0;
  local_1c8 = 0;
  do {
    while( true ) {
      local_188 = TVar12.info;
      local_180 = TVar12._0_8_;
      TVar12 = ParserBase::peek(&this->super_ParserBase);
      TVar2 = TVar12.kind;
      uVar11 = (ulong)TVar2;
      if (TVar2 != DefaultKeyword) break;
      if (((ulong)local_220 & 0xfffffff) != 0 && (local_1c8 & 1) == 0) {
        local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        SVar4 = Token::location((Token *)local_108);
        this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x810005,SVar4);
        local_1c8 = CONCAT71((int7)(uVar11 >> 8),1);
        Diagnostic::addNote(this_01,(DiagCode)0xa0001,local_220);
      }
      local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      local_220 = Token::location((Token *)local_108);
      TVar12 = ParserBase::consume(&this->super_ParserBase);
      TVar13 = ParserBase::consumeIf(&this->super_ParserBase,Colon);
      pMVar7 = parseGenerateBlock(this);
      pDVar9 = slang::syntax::SyntaxFactory::defaultCaseItem
                         (this_00,TVar12,TVar13,&pMVar7->super_SyntaxNode);
      local_108._0_8_ = pDVar9;
      SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_148,
                 (CaseItemSyntax **)local_108);
      TVar12.info = local_188;
      TVar12.kind = (undefined2)local_180;
      TVar12._2_1_ = local_180._2_1_;
      TVar12.numFlags.raw = local_180._3_1_;
      TVar12.rawLen = local_180._4_4_;
    }
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar2);
    if (!bVar1) {
      if (local_148[0].len == 0) {
        SVar4 = Token::location(&local_1c0);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x40005,SVar4);
      }
      TVar13 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
      TVar12 = local_1c0;
      local_108._8_4_ = 1;
      local_108._16_8_ = (SyntaxNode *)0x0;
      auStack_f0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
      auStack_f0._8_8_ = local_170;
      auStack_f0._16_8_ = local_178;
      local_d8._M_extent_value = (size_t)local_170;
      local_108._0_8_ = &PTR_getChild_00c8c880;
      local_158 = local_180;
      pIStack_150 = local_188;
      iVar3 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                        (local_148,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)TVar13.info);
      local_1d8 = CONCAT44(extraout_var_00,iVar3);
      local_200._8_4_ = 1;
      local_1f0 = 0;
      uStack_1e8 = 0;
      local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00c94d88
      ;
      closeParen.info = pIStack_150;
      closeParen.kind = (undefined2)local_158;
      closeParen._2_1_ = local_158._2_1_;
      closeParen.numFlags.raw = local_158._3_1_;
      closeParen.rawLen = local_158._4_4_;
      openParen.info = local_198;
      openParen.kind = (undefined2)local_190;
      openParen._2_1_ = local_190._2_1_;
      openParen.numFlags.raw = local_190._3_1_;
      openParen.rawLen = local_190._4_4_;
      local_168 = TVar13;
      pCVar10 = slang::syntax::SyntaxFactory::caseGenerate
                          (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_108,
                           TVar12,openParen,local_1a0,closeParen,
                           (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_200._M_first,TVar13);
      if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
        operator_delete(local_148[0].data_);
      }
      return pCVar10;
    }
    Token::Token(&local_210);
    local_108._8_8_ = 0;
    local_108._0_8_ = auStack_f0;
    local_108._16_8_ = (SyntaxNode *)0x8;
    TVar13 = ParserBase::peek(&this->super_ParserBase);
    local_1b0 = TVar13;
    bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar13.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar4 = Token::location(&local_1b0);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar4);
      }
      local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_0066e72d:
      src = local_210.info;
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar13.kind);
      if (bVar1) {
        pEVar5 = parseExpression(this);
        local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
        local_1f0 = CONCAT71(local_1f0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                   (TokenOrSyntax *)&local_200._M_first);
        TVar12 = ParserBase::peek(&this->super_ParserBase);
        uVar6 = TVar12._0_8_;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar12.kind);
        if (TVar12.kind != EndOfFile && !bVar1) {
          do {
            if ((short)uVar6 != 0x18) {
              ParserBase::expect(&this->super_ParserBase,Comma);
              do {
                bVar1 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                  (&this->super_ParserBase,(DiagCode)0x10001,false);
                if (!bVar1) {
                  local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
                  goto LAB_0066e72d;
                }
                bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
              } while (!bVar1);
            }
            local_200._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_1f0 = local_1f0 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                       (TokenOrSyntax *)&local_200._M_first);
            TVar12 = ParserBase::peek(&this->super_ParserBase);
            TVar2 = TVar12.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar2);
            if (TVar2 == EndOfFile || bVar1) {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
              break;
            }
            if ((TVar13.info == TVar12.info && TVar13.kind == TVar2) &&
               (bVar1 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                  (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
            pEVar5 = parseExpression(this);
            local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
            local_1f0 = CONCAT71(local_1f0._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                       (TokenOrSyntax *)&local_200._M_first);
            TVar14 = ParserBase::peek(&this->super_ParserBase);
            uVar6 = TVar14._0_8_;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar14.kind);
            uVar11 = TVar12._0_8_ & 0xffffffff;
            TVar13.info = TVar12.info;
            TVar13.kind = (short)uVar11;
            TVar13._2_1_ = (char)(uVar11 >> 0x10);
            TVar13.numFlags.raw = (char)(uVar11 >> 0x18);
            TVar13.rawLen = (int)(uVar11 >> 0x20);
          } while (TVar14.kind != EndOfFile && !bVar1);
        }
        local_210 = ParserBase::expect(&this->super_ParserBase,Colon);
        goto LAB_0066e72d;
      }
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar13,Colon,&local_210,(DiagCode)0x10001);
      src = extraout_RDX;
    }
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
    TVar12 = local_210;
    local_1d8 = CONCAT44(extraout_var,iVar3);
    local_200._8_4_ = 3;
    local_1f0 = 0;
    uStack_1e8 = 0;
    local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00c94f78;
    pMVar7 = parseGenerateBlock(this);
    pSVar8 = slang::syntax::SyntaxFactory::standardCaseItem
                       (this_00,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                &local_200._M_first,TVar12,&pMVar7->super_SyntaxNode);
    local_1b0._0_8_ = pSVar8;
    SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_148,
               (CaseItemSyntax **)&local_1b0);
    TVar12.info = local_188;
    TVar12.kind = (undefined2)local_180;
    TVar12._2_1_ = local_180._2_1_;
    TVar12.numFlags.raw = local_180._3_1_;
    TVar12.rawLen = local_180._4_4_;
    if ((pointer)local_108._0_8_ != (pointer)auStack_f0) {
      operator_delete((void *)local_108._0_8_);
      TVar12.info = local_188;
      TVar12.kind = (undefined2)local_180;
      TVar12._2_1_ = local_180._2_1_;
      TVar12.numFlags.raw = local_180._3_1_;
      TVar12.rawLen = local_180._4_4_;
    }
  } while( true );
}

Assistant:

CaseGenerateSyntax& Parser::parseCaseGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<CaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleGenerateDefaultCases, peek().location());
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            itemBuffer.push_back(&factory.defaultCaseItem(def, colon, parseGenerateBlock()));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });
            itemBuffer.push_back(
                &factory.standardCaseItem(buffer.copy(alloc), colon, parseGenerateBlock()));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseGenerateEmpty, keyword.location());

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseGenerate(attributes, keyword, openParen, condition, closeParen,
                                itemBuffer.copy(alloc), endcase);
}